

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O1

bool __thiscall
trial::protocol::buffer::basic_string<unsigned_char,_trial::protocol::buffer::base<unsigned_char>_>
::grow(basic_string<unsigned_char,_trial::protocol::buffer::base<unsigned_char>_> *this,
      size_type delta)

{
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *this_00;
  size_type sVar1;
  bool bVar2;
  size_type __res;
  
  this_00 = this->content;
  __res = delta + this_00->_M_string_length + 1;
  sVar1 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)(this_00->_M_dataplus)._M_p != &this_00->field_2) {
    sVar1 = (this_00->field_2)._M_allocated_capacity;
  }
  bVar2 = true;
  if (sVar1 < __res) {
    if (__res >> 0x3e == 0) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      reserve(this_00,__res);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

virtual bool grow(size_type delta)
    {
        const size_type size = content.size() + delta + 1;
        if (size > content.capacity())
        {
            if (size > content.max_size())
                return false;
            content.reserve(size);
        }
        return true;
    }